

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_CCtx_setParameter(ZSTD_CCtx *cctx,ZSTD_cParameter param,int value)

{
  int iVar1;
  size_t sVar2;
  int in_EDX;
  ZSTD_cParameter in_ESI;
  long in_RDI;
  ZSTD_CCtx_params *in_stack_fffffffffffffff8;
  
  if (*(int *)(in_RDI + 0xe18) != 0) {
    iVar1 = ZSTD_isUpdateAuthorized(in_ESI);
    if (iVar1 == 0) {
      return 0xffffffffffffffc4;
    }
    *(undefined4 *)(in_RDI + 4) = 1;
  }
  if ((((in_ESI != ZSTD_c_experimentalParam2) && (7 < in_ESI - ZSTD_c_compressionLevel)) &&
      (in_ESI != ZSTD_c_targetCBlockSize)) &&
     ((4 < in_ESI - ZSTD_c_enableLongDistanceMatching && (2 < in_ESI - ZSTD_c_contentSizeFlag)))) {
    if (in_ESI == ZSTD_c_nbWorkers) {
      if ((in_EDX != 0) && (*(long *)(in_RDI + 0x388) != 0)) {
        return 0xffffffffffffffd8;
      }
    }
    else if (((1 < in_ESI - ZSTD_c_jobSize) && (in_ESI != ZSTD_c_experimentalParam1)) &&
            ((2 < in_ESI - ZSTD_c_experimentalParam3 && (0xc < in_ESI - ZSTD_c_experimentalParam7)))
            ) {
      return 0xffffffffffffffd8;
    }
  }
  sVar2 = ZSTD_CCtxParams_setParameter
                    (in_stack_fffffffffffffff8,(ZSTD_cParameter)((ulong)in_RDI >> 0x20),(int)in_RDI)
  ;
  return sVar2;
}

Assistant:

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx* cctx, ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParameter (%i, %i)", (int)param, value);
    if (cctx->streamStage != zcss_init) {
        if (ZSTD_isUpdateAuthorized(param)) {
            cctx->cParamsChanged = 1;
        } else {
            RETURN_ERROR(stage_wrong, "can only set params in cctx init stage");
    }   }

    switch(param)
    {
    case ZSTD_c_nbWorkers:
        RETURN_ERROR_IF((value!=0) && cctx->staticSize, parameter_unsupported,
                        "MT not compatible with static alloc");
        break;

    case ZSTD_c_compressionLevel:
    case ZSTD_c_windowLog:
    case ZSTD_c_hashLog:
    case ZSTD_c_chainLog:
    case ZSTD_c_searchLog:
    case ZSTD_c_minMatch:
    case ZSTD_c_targetLength:
    case ZSTD_c_strategy:
    case ZSTD_c_ldmHashRateLog:
    case ZSTD_c_format:
    case ZSTD_c_contentSizeFlag:
    case ZSTD_c_checksumFlag:
    case ZSTD_c_dictIDFlag:
    case ZSTD_c_forceMaxWindow:
    case ZSTD_c_forceAttachDict:
    case ZSTD_c_literalCompressionMode:
    case ZSTD_c_jobSize:
    case ZSTD_c_overlapLog:
    case ZSTD_c_rsyncable:
    case ZSTD_c_enableDedicatedDictSearch:
    case ZSTD_c_enableLongDistanceMatching:
    case ZSTD_c_ldmHashLog:
    case ZSTD_c_ldmMinMatch:
    case ZSTD_c_ldmBucketSizeLog:
    case ZSTD_c_targetCBlockSize:
    case ZSTD_c_srcSizeHint:
    case ZSTD_c_stableInBuffer:
    case ZSTD_c_stableOutBuffer:
    case ZSTD_c_blockDelimiters:
    case ZSTD_c_validateSequences:
    case ZSTD_c_useBlockSplitter:
    case ZSTD_c_useRowMatchFinder:
    case ZSTD_c_deterministicRefPrefix:
    case ZSTD_c_prefetchCDictTables:
    case ZSTD_c_enableSeqProducerFallback:
    case ZSTD_c_maxBlockSize:
    case ZSTD_c_searchForExternalRepcodes:
        break;

    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
    return ZSTD_CCtxParams_setParameter(&cctx->requestedParams, param, value);
}